

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

void __thiscall cmFileAPI::cmFileAPI(cmFileAPI *this,cmake *cm)

{
  ptrdiff_t *this_00;
  string *__lhs;
  Value *pVVar1;
  CharReader *__p;
  StreamWriter *__p_00;
  unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> local_248;
  allocator<char> local_239;
  String local_238;
  Value local_218;
  undefined1 local_1f0 [8];
  StreamWriterBuilder wbuilder;
  allocator<char> local_1b1;
  String local_1b0;
  Value local_190;
  allocator<char> local_161;
  String local_160;
  Value local_140;
  allocator<char> local_111;
  String local_110;
  Value local_f0;
  allocator<char> local_c1;
  String local_c0;
  Value local_a0;
  undefined1 local_78 [8];
  CharReaderBuilder rbuilder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  cmake *local_18;
  cmake *cm_local;
  cmFileAPI *this_local;
  
  this->CMakeInstance = cm;
  local_18 = cm;
  cm_local = (cmake *)this;
  std::__cxx11::string::string((string *)&this->APIv1);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->ReplyFiles);
  this->QueryExists = false;
  Query::Query(&this->TopQuery);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>_>_>
  ::map(&this->ClientQueries);
  std::
  map<cmFileAPI::Object,_Json::Value,_std::less<cmFileAPI::Object>,_std::allocator<std::pair<const_cmFileAPI::Object,_Json::Value>_>_>
  ::map(&this->ReplyIndexObjects);
  std::unique_ptr<Json::CharReader,std::default_delete<Json::CharReader>>::
  unique_ptr<std::default_delete<Json::CharReader>,void>
            ((unique_ptr<Json::CharReader,std::default_delete<Json::CharReader>> *)&this->JsonReader
            );
  std::unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>>::
  unique_ptr<std::default_delete<Json::StreamWriter>,void>
            ((unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>> *)
             &this->JsonWriter);
  __lhs = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  std::operator+(&local_38,__lhs,"/.cmake/api/v1");
  std::__cxx11::string::operator=((string *)&this->APIv1,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  Json::CharReaderBuilder::CharReaderBuilder((CharReaderBuilder *)local_78);
  Json::Value::Value(&local_a0,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"collectComments",&local_c1);
  pVVar1 = Json::CharReaderBuilder::operator[]((CharReaderBuilder *)local_78,&local_c0);
  Json::Value::operator=(pVVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  Json::Value::~Value(&local_a0);
  Json::Value::Value(&local_f0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"failIfExtra",&local_111);
  pVVar1 = Json::CharReaderBuilder::operator[]((CharReaderBuilder *)local_78,&local_110);
  Json::Value::operator=(pVVar1,&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  Json::Value::~Value(&local_f0);
  Json::Value::Value(&local_140,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"rejectDupKeys",&local_161);
  pVVar1 = Json::CharReaderBuilder::operator[]((CharReaderBuilder *)local_78,&local_160);
  Json::Value::operator=(pVVar1,&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  Json::Value::~Value(&local_140);
  Json::Value::Value(&local_190,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"strictRoot",&local_1b1);
  pVVar1 = Json::CharReaderBuilder::operator[]((CharReaderBuilder *)local_78,&local_1b0);
  Json::Value::operator=(pVVar1,&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  Json::Value::~Value(&local_190);
  __p = Json::CharReaderBuilder::newCharReader((CharReaderBuilder *)local_78);
  this_00 = &wbuilder.settings_.limit_;
  std::unique_ptr<Json::CharReader,std::default_delete<Json::CharReader>>::
  unique_ptr<std::default_delete<Json::CharReader>,void>
            ((unique_ptr<Json::CharReader,std::default_delete<Json::CharReader>> *)this_00,__p);
  std::unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_>::operator=
            (&this->JsonReader,
             (unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_> *)this_00);
  std::unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_>::~unique_ptr
            ((unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_> *)this_00);
  Json::StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)local_1f0);
  Json::Value::Value(&local_218,"\t");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"indentation",&local_239);
  pVVar1 = Json::StreamWriterBuilder::operator[]((StreamWriterBuilder *)local_1f0,&local_238);
  Json::Value::operator=(pVVar1,&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  Json::Value::~Value(&local_218);
  __p_00 = Json::StreamWriterBuilder::newStreamWriter((StreamWriterBuilder *)local_1f0);
  std::unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>>::
  unique_ptr<std::default_delete<Json::StreamWriter>,void>
            ((unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>> *)&local_248,
             __p_00);
  std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::operator=
            (&this->JsonWriter,&local_248);
  std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::~unique_ptr
            (&local_248);
  Json::StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)local_1f0);
  Json::CharReaderBuilder::~CharReaderBuilder((CharReaderBuilder *)local_78);
  return;
}

Assistant:

cmFileAPI::cmFileAPI(cmake* cm)
  : CMakeInstance(cm)
{
  this->APIv1 =
    this->CMakeInstance->GetHomeOutputDirectory() + "/.cmake/api/v1";

  Json::CharReaderBuilder rbuilder;
  rbuilder["collectComments"] = false;
  rbuilder["failIfExtra"] = true;
  rbuilder["rejectDupKeys"] = false;
  rbuilder["strictRoot"] = true;
  this->JsonReader =
    std::unique_ptr<Json::CharReader>(rbuilder.newCharReader());

  Json::StreamWriterBuilder wbuilder;
  wbuilder["indentation"] = "\t";
  this->JsonWriter =
    std::unique_ptr<Json::StreamWriter>(wbuilder.newStreamWriter());
}